

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormTests.cpp
# Opt level: O0

void __thiscall
MockUserCreateForm::MockUserCreateForm
          (MockUserCreateForm *this,string *firstName,string *lastName,string *email,
          string *password,bool adminStatus)

{
  bool adminStatus_local;
  string *password_local;
  string *email_local;
  string *lastName_local;
  string *firstName_local;
  MockUserCreateForm *this_local;
  
  ModelForm<BaseUser>::ModelForm(&this->super_ModelForm<BaseUser>);
  (this->super_ModelForm<BaseUser>).super_Form._vptr_Form = (_func_int **)&PTR_clean_00173ee0;
  std::__cxx11::string::string((string *)&this->firstName,(string *)firstName);
  std::__cxx11::string::string((string *)&this->lastName,(string *)lastName);
  std::__cxx11::string::string((string *)&this->email,(string *)email);
  std::__cxx11::string::string((string *)&this->password,(string *)password);
  this->adminStatus = adminStatus;
  return;
}

Assistant:

MockUserCreateForm::MockUserCreateForm(const string &firstName, const string &lastName, const string &email,
                                       const string &password, bool adminStatus) : firstName(firstName),
                                                                                   lastName(lastName), email(email),
                                                                                   password(password),
                                                                                   adminStatus(adminStatus) {}